

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O2

bool __thiscall
diy::Master::Command<PointBlock<3U>_>::skip(Command<PointBlock<3U>_> *this,int i,Master *m)

{
  bool bVar1;
  
  bVar1 = std::function<bool_(int,_const_diy::Master_&)>::operator()(&this->s,i,m);
  return bVar1;
}

Assistant:

bool  skip(int i, const Master& m) const override                             { return s(i,m); }